

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O0

void __thiscall
solitaire::colliders::StockPileColliderTests_emptyCoveredCardsCollidesWith_Test::
StockPileColliderTests_emptyCoveredCardsCollidesWith_Test
          (StockPileColliderTests_emptyCoveredCardsCollidesWith_Test *this)

{
  StockPileColliderTests_emptyCoveredCardsCollidesWith_Test *this_local;
  
  StockPileColliderTests::StockPileColliderTests(&this->super_StockPileColliderTests);
  (this->super_StockPileColliderTests).super_Test._vptr_Test =
       (_func_int **)&PTR__StockPileColliderTests_emptyCoveredCardsCollidesWith_Test_004fe378;
  return;
}

Assistant:

TEST_F(StockPileColliderTests, emptyCoveredCardsCollidesWith) {
    Cards noCards;
    EXPECT_CALL(stockPileMock, getCards()).WillRepeatedly(ReturnRef(noCards));
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillRepeatedly(Return(std::nullopt));

    EXPECT_FALSE(collider.coveredCardsCollidesWith(
        pilePosition - Position {1, 0}));
    EXPECT_FALSE(collider.coveredCardsCollidesWith(
        pilePosition - Position {0, 1}));
    EXPECT_FALSE(collider.coveredCardsCollidesWith(
        pileBottomRightCorner + Position {1, 0}));
    EXPECT_FALSE(collider.coveredCardsCollidesWith(
        pileBottomRightCorner + Position {0, 1}));
    EXPECT_TRUE(collider.coveredCardsCollidesWith(
        pilePosition));
    EXPECT_TRUE(collider.coveredCardsCollidesWith(
        pileBottomRightCorner));
}